

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int HeadDataReplyAndAuxDataSeanet
              (SEANET *pSeanet,uchar *scanline,double *pAngle,uchar *strippedauxdatabuf,
              int *pNbstrippedauxdatabytes)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  int nbdatabytes;
  int mid;
  uchar *local_858;
  double *local_850;
  uchar *local_848;
  int *local_840;
  uchar databuf [2048];
  
  nbdatabytes = 0;
  mid = 0;
  iVar4 = 0;
  iVar6 = 4;
  local_858 = scanline;
  local_850 = pAngle;
  local_848 = strippedauxdatabuf;
  local_840 = pNbstrippedauxdatabytes;
  do {
    do {
      if (iVar4 == 2) {
        pSeanet->HeadStatus = (uint)databuf[0x10];
        uVar8 = (ulong)(CONCAT24(SUB42(databuf._18_4_,2),databuf._18_4_) & 0xffff0000ffff);
        pSeanet->HeadHdCtrl = (HDCTRL)(int)uVar8;
        pSeanet->HeadRangescale = (int)(uVar8 >> 0x20);
        pSeanet->HeadIGain = (uint)databuf[0x1a];
        pSeanet->HeadSlope = (uint)(ushort)databuf._27_2_;
        pSeanet->HeadADSpan = (uint)databuf[0x1d];
        pSeanet->HeadADLow = (uint)databuf[0x1e];
        uVar8 = (ulong)CONCAT24(SUB42(databuf._33_4_,2),databuf._33_4_) & 0xffffffff0000ffff;
        pSeanet->HeadADInterval = (int)uVar8;
        pSeanet->HeadLeftLim = (int)(uVar8 >> 0x20);
        pSeanet->HeadRightLim = (uint)(ushort)databuf._37_2_;
        pSeanet->HeadSteps = (uint)databuf[0x27];
        *local_850 = (double)(((ushort)databuf._40_2_ + 0xc80) % 0x1900) * 0.05625;
        uVar3 = (uint)(ushort)databuf._42_2_;
        pSeanet->Dbytes = (uint)(ushort)databuf._42_2_;
        if ((ushort)databuf._42_2_ + 0x2d == nbdatabytes) {
          if (pSeanet->adc8on == 0) {
            for (lVar5 = 0; lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
              bVar1 = databuf[lVar5 + 0x2c];
              local_858[lVar5 * 2] = bVar1 & 0xf0;
              local_858[lVar5 * 2 + 1] = bVar1 << 4;
              uVar3 = pSeanet->Dbytes;
            }
            pSeanet->HeadNBins = uVar3 * 2;
          }
          else {
            memcpy(local_858,databuf + 0x2c,(ulong)(uint)(ushort)databuf._42_2_);
            pSeanet->HeadNBins = pSeanet->Dbytes;
          }
          iVar6 = 0;
        }
        else {
LAB_001736a3:
          puts("A Seanet is not responding correctly. ");
          iVar6 = 1;
        }
        return iVar6;
      }
      memset(databuf,0,0x800);
      nbdatabytes = 0;
      iVar2 = GetMsgWithoutMIDSeanet(pSeanet,&mid,databuf,0x800,&nbdatabytes);
      iVar4 = mid;
      if ((iVar2 != 0) || (bVar7 = iVar6 == 0, iVar6 = iVar6 + -1, bVar7)) goto LAB_001736a3;
    } while (mid != 8);
    lVar5 = (long)nbdatabytes;
    memcpy(local_848,databuf + 0xf,lVar5 - 0xfU);
    *local_840 = (int)(lVar5 - 0xfU);
  } while( true );
}

Assistant:

inline int HeadDataReplyAndAuxDataSeanet(SEANET* pSeanet, 
										 unsigned char* scanline, double* pAngle, 
										 unsigned char* strippedauxdatabuf, int* pNbstrippedauxdatabytes)
{
	unsigned char databuf[MAX_NB_BYTES_SEANET];
	int nbdatabytes = 0;
	int mid = 0;
	int i = 0;
	uShort_SEANET word;
	int j = 0;

	// Use this kind of while for all messages?
	while (mid != mtHeadData)
	{
		// Wait for a message.
		memset(databuf, 0, sizeof(databuf));
		nbdatabytes = 0;
		//if (GetLatestMsgWithoutMIDSeanet(pSeanet, &mid, databuf, sizeof(databuf), &nbdatabytes)
		//	!= EXIT_SUCCESS)
		if (GetMsgWithoutMIDSeanet(pSeanet, &mid, databuf, sizeof(databuf), &nbdatabytes)
			!= EXIT_SUCCESS)
		{ 
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		// Message counter...
		i++;
		if (i > 4) 
		{
			printf("A Seanet is not responding correctly. \n");
			return EXIT_FAILURE;	
		}

		if (mid == mtAuxData)
		{
			// Should remove also the final LF...

			//memcpy(auxdatabuf, databuf, nbdatabytes);
			//*pNbauxdatabytes = nbdatabytes;
			memcpy(strippedauxdatabuf, databuf+15, nbdatabytes-15);
			*pNbstrippedauxdatabytes = nbdatabytes-15;
		}
	}

	// Analyze data.

	//memset(pSeanetData, 0, sizeof(SEANETDATA));

	// Head Status.
	pSeanet->HeadStatus = (unsigned char)databuf[16];

	// HdCtrl.
	word.c[0] = (unsigned char)databuf[18]; // LSB.
	word.c[1] = (unsigned char)databuf[19]; // MSB.
	pSeanet->HeadHdCtrl.i = word.v;

	// Rangescale. Normally, we should check the unit but it should have been requested in m...
	word.c[0] = (unsigned char)databuf[20]; // LSB.
	word.c[1] = (unsigned char)databuf[21]; // MSB.
	pSeanet->HeadRangescale = word.v;

	// Gain.
	pSeanet->HeadIGain = (unsigned char)databuf[26];

	// Slope.
	word.c[0] = (unsigned char)databuf[27]; // LSB.
	word.c[1] = (unsigned char)databuf[28]; // MSB.
	pSeanet->HeadSlope = word.v;

	// ADSpan.
	pSeanet->HeadADSpan = (unsigned char)databuf[29];

	// ADLow.
	pSeanet->HeadADLow = (unsigned char)databuf[30];

	// ADInterval.
	word.c[0] = (unsigned char)databuf[33]; // LSB.
	word.c[1] = (unsigned char)databuf[34]; // MSB.
	pSeanet->HeadADInterval = word.v;

	// LeftLim.
	word.c[0] = (unsigned char)databuf[35]; // LSB.
	word.c[1] = (unsigned char)databuf[36]; // MSB.
	pSeanet->HeadLeftLim = word.v;

	// RightLim.
	word.c[0] = (unsigned char)databuf[37]; // LSB.
	word.c[1] = (unsigned char)databuf[38]; // MSB.
	pSeanet->HeadRightLim = word.v;

	// Steps.
	pSeanet->HeadSteps = (unsigned char)databuf[39];

	// Transducer Bearing. 
	// This is the position of the transducer for the current scanline (0..6399 in 1/16 Gradian units).

	// Ahead corresponds to 3200?

	word.c[0] = (unsigned char)databuf[40]; // LSB.
	word.c[1] = (unsigned char)databuf[41]; // MSB.
	*pAngle = ((word.v-3200+6400)%6400)*0.05625; // Angle of the transducer in degrees (0.05625 = (1/16)*(9/10)).

	// Dbytes.
	word.c[0] = (unsigned char)databuf[42]; // LSB.
	word.c[1] = (unsigned char)databuf[43]; // MSB.
	pSeanet->Dbytes = word.v; // Dbytes defines the number of Range Bins that the sonar will generate for the Head Data reply message.

	// There are 44 bytes of Message Header and Device Parameter Block.

	if (44+pSeanet->Dbytes+1 != nbdatabytes)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// We should take into account ADLow and ADSpan here?

	// Retrieve the scanline data from the data received.
	if (!pSeanet->adc8on)	
	{ 
		// If adc8on = 0, the scanlines data received are in 4 bit (1/2 byte).
		// The amplitude values are between 0 and 15 so we multiply by 16
		// to get values between 0 and 255.
		for (j = 0; j < pSeanet->Dbytes; j++)
		{
			scanline[2*j+0] = (unsigned char)((databuf[j+44]>>4)*16);
			scanline[2*j+1] = (unsigned char)(((databuf[j+44]<<4)>>4)*16);
		}
		pSeanet->HeadNBins = 2*pSeanet->Dbytes;
	}
	else	
	{
		// If adc8on = 1, the scanlines data received are in 8 bit (1 byte).
		// The amplitude values are between 0 and 255.
		memcpy(scanline, databuf+44, pSeanet->Dbytes); // Copy the data received without the header (which was the 44 first bytes).
		pSeanet->HeadNBins = pSeanet->Dbytes;
	}

	// Last data...?

	return EXIT_SUCCESS;
}